

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_address.cpp
# Opt level: O2

bool __thiscall
zmq::tcp_address_mask_t::match_address(tcp_address_mask_t *this,sockaddr *ss_,socklen_t ss_len_)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  char *errmsg_;
  size_t __n;
  void *__s1;
  long lStack_40;
  
  if (((ss_len_ < 0x10) || (ss_ == (sockaddr *)0x0)) || (this->_address_mask == -1)) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
            "_address_mask != -1 && ss_ != NULL && ss_len_ >= static_cast<socklen_t> (sizeof (struct sockaddr))"
            ,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/tcp_address.cpp"
            ,0x10b);
    fflush(_stderr);
    zmq_abort(
             "_address_mask != -1 && ss_ != NULL && ss_len_ >= static_cast<socklen_t> (sizeof (struct sockaddr))"
             );
  }
  if (ss_->sa_family != (this->_network_address).generic.sa_family) {
    return false;
  }
  if (this->_address_mask < 1) {
    return true;
  }
  if (ss_->sa_family == 10) {
    if (ss_len_ == 0x1c) {
      iVar3 = 0x80;
      lStack_40 = 8;
      goto LAB_00168316;
    }
    errmsg_ = "ss_len_ == sizeof (struct sockaddr_in6)";
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","ss_len_ == sizeof (struct sockaddr_in6)",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/tcp_address.cpp"
            ,0x114);
    iVar3 = 0x80;
    lStack_40 = 8;
  }
  else {
    if (ss_len_ == 0x10) {
      iVar3 = 0x20;
      lStack_40 = 4;
      goto LAB_00168316;
    }
    errmsg_ = "ss_len_ == sizeof (struct sockaddr_in)";
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","ss_len_ == sizeof (struct sockaddr_in)",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/tcp_address.cpp"
            ,0x11c);
    iVar3 = 0x20;
    lStack_40 = 4;
  }
  fflush(_stderr);
  zmq_abort(errmsg_);
LAB_00168316:
  __s1 = (void *)((long)&this->_network_address + lStack_40);
  if (this->_address_mask < iVar3) {
    iVar3 = this->_address_mask;
  }
  __n = (size_t)(iVar3 / 8);
  iVar1 = bcmp(__s1,ss_->sa_data + lStack_40 + -2,__n);
  if (iVar1 == 0) {
    uVar2 = 0xff << (8U - (char)(iVar3 % 8) & 0x1f);
    if ((char)uVar2 == '\0') {
      return true;
    }
    if ((uVar2 & (byte)(*(byte *)((long)__s1 + __n) ^ (ss_->sa_data + lStack_40 + -2)[__n])) == 0) {
      return true;
    }
  }
  return false;
}

Assistant:

bool zmq::tcp_address_mask_t::match_address (const struct sockaddr *ss_,
                                             const socklen_t ss_len_) const
{
    zmq_assert (_address_mask != -1 && ss_ != NULL
                && ss_len_
                     >= static_cast<socklen_t> (sizeof (struct sockaddr)));

    if (ss_->sa_family != _network_address.generic.sa_family)
        return false;

    if (_address_mask > 0) {
        int mask;
        const uint8_t *our_bytes, *their_bytes;
        if (ss_->sa_family == AF_INET6) {
            zmq_assert (ss_len_ == sizeof (struct sockaddr_in6));
            their_bytes = reinterpret_cast<const uint8_t *> (
              &((reinterpret_cast<const struct sockaddr_in6 *> (ss_))
                  ->sin6_addr));
            our_bytes = reinterpret_cast<const uint8_t *> (
              &_network_address.ipv6.sin6_addr);
            mask = sizeof (struct in6_addr) * 8;
        } else {
            zmq_assert (ss_len_ == sizeof (struct sockaddr_in));
            their_bytes = reinterpret_cast<const uint8_t *> (&(
              (reinterpret_cast<const struct sockaddr_in *> (ss_))->sin_addr));
            our_bytes = reinterpret_cast<const uint8_t *> (
              &_network_address.ipv4.sin_addr);
            mask = sizeof (struct in_addr) * 8;
        }
        if (_address_mask < mask)
            mask = _address_mask;

        const size_t full_bytes = mask / 8;
        if (memcmp (our_bytes, their_bytes, full_bytes) != 0)
            return false;

        const uint8_t last_byte_bits = 0xffU << (8 - mask % 8);
        if (last_byte_bits) {
            if ((their_bytes[full_bytes] & last_byte_bits)
                != (our_bytes[full_bytes] & last_byte_bits))
                return false;
        }
    }

    return true;
}